

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

int CMdo_non_CM_handler(CMConnection conn,int header,char *buffer,size_t length)

{
  int iVar1;
  long lVar2;
  
  if (0 < (long)foreign_handler_count) {
    lVar2 = 0;
    do {
      if (*(int *)((long)&foreign_handler_list->header + lVar2) == header) {
        iVar1 = (**(code **)((long)&foreign_handler_list->handler + lVar2))(conn,conn->trans);
        return iVar1;
      }
      lVar2 = lVar2 + 0x10;
    } while ((long)foreign_handler_count * 0x10 != lVar2);
  }
  return -1;
}

Assistant:

int
 CMdo_non_CM_handler(CMConnection conn, int header, char *buffer, size_t length)
 {
     int i = 0;
     while (i < foreign_handler_count) {
	 if (foreign_handler_list[i].header == header) {
	     return foreign_handler_list[i].handler(conn, conn->trans, buffer, 
					     length);
	 }
	 i++;
     }
     return -1;
 }